

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O1

void __thiscall Listener::Listener(Listener *this,io_context *context,endpoint *endpoint,bool webs)

{
  acceptor *this_00;
  implementation_type *impl;
  char *what;
  error_code eCode;
  boolean<1,_2> local_7c;
  undefined1 local_78 [16];
  object_fns *local_68;
  strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_> local_48;
  undefined8 uVar1;
  
  (this->super_enable_shared_from_this<Listener>)._M_weak_this.
  super___weak_ptr<Listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Listener>)._M_weak_this.
  super___weak_ptr<Listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->ioc = context;
  local_48.executor_.bits_ = 0;
  local_48.executor_.io_context_ = context;
  boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>::
  create_implementation<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>
            ((basic_executor_type<std::allocator<void>,_0U> *)&local_48.impl_,&local_48);
  boost::asio::execution::
  any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>
  ::
  any_executor<boost::asio::strand<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>>
            ((any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>
              *)local_78,&local_48,(type *)0x0);
  this_00 = &this->acceptor;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl(&this_00->impl_,(executor_type *)local_78);
  (*local_68->destroy)((any_executor_base *)local_78);
  if (local_48.impl_.
      super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.impl_.
               super___shared_ptr<boost::asio::detail::strand_executor_service::strand_impl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  this->websocket = webs;
  local_78._0_4_ = 0;
  local_78._4_4_ = local_78._4_4_ & 0xffffff00;
  local_78._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
  local_7c.value_ = (uint)((endpoint->impl_).data_.base.sa_family != 2) * 8 + 2;
  impl = &(this->acceptor).impl_.implementation_;
  boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::open
            ((this->acceptor).impl_.service_,(char *)impl,(int)&local_7c);
  if (local_78[4] == '\0') {
    local_7c.value_ = 1;
    boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::
    set_option<boost::asio::detail::socket_option::boolean<1,2>>
              ((this_00->impl_).service_,impl,&local_7c,(error_code *)local_78);
    if (local_78[4] == '\0') {
      boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::bind
                ((this_00->impl_).service_,(int)impl,(sockaddr *)endpoint,(socklen_t)local_78);
      if (local_78[4] == '\x01') {
        uVar1 = CONCAT44(local_78._4_4_,local_78._0_4_);
        what = "helics acceptor bind";
      }
      else {
        boost::asio::detail::reactive_socket_service_base::listen
                  (&((this_00->impl_).service_)->super_reactive_socket_service_base,(int)impl,0x1000
                  );
        if (local_78[4] != '\x01') {
          return;
        }
        uVar1 = CONCAT44(local_78._4_4_,local_78._0_4_);
        what = "helics acceptor listen";
      }
    }
    else {
      uVar1 = CONCAT44(local_78._4_4_,local_78._0_4_);
      what = "helics acceptor set_option";
    }
  }
  else {
    uVar1 = CONCAT44(local_78._4_4_,local_78._0_4_);
    what = "helics acceptor open";
  }
  eCode.cat_ = (error_category *)local_78._8_8_;
  eCode.val_ = (int)uVar1;
  eCode.failed_ = (bool)(char)((ulong)uVar1 >> 0x20);
  eCode._5_3_ = (int3)((ulong)uVar1 >> 0x28);
  fail(eCode,what);
  return;
}

Assistant:

Listener(net::io_context& context, const tcp::endpoint& endpoint, bool webs = false):
        ioc(context), acceptor(net::make_strand(ioc)), websocket{webs}
    {
        beast::error_code eCode;

        // Open the acceptor
        eCode = acceptor.open(endpoint.protocol(), eCode);
        if (eCode) {
            fail(eCode, "helics acceptor open");
            return;
        }

        // Allow address reuse
        (void)(acceptor.set_option(net::socket_base::reuse_address(true), eCode));
        if (eCode) {
            fail(eCode, "helics acceptor set_option");
            return;
        }

        // Bind to the server address
        (void)(acceptor.bind(endpoint, eCode));
        if (eCode) {
            fail(eCode, "helics acceptor bind");
            return;
        }

        // Start listening for connections
        (void)(acceptor.listen(net::socket_base::max_listen_connections, eCode));
        if (eCode) {
            fail(eCode, "helics acceptor listen");
            return;
        }
    }